

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_reset(sqlite3_stmt *pStmt)

{
  sqlite3 *db;
  int rc;
  int iVar1;
  Vdbe *v;
  
  if (pStmt == (sqlite3_stmt *)0x0) {
    iVar1 = 0;
  }
  else {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    if (0 < *(long *)(pStmt + 0xb8)) {
      invokeProfileCallback(db,(Vdbe *)pStmt);
    }
    rc = sqlite3VdbeReset((Vdbe *)pStmt);
    pStmt[199] = (sqlite3_stmt)0x1;
    iVar1 = 0;
    *(undefined4 *)(pStmt + 0x34) = 0;
    *(undefined2 *)(pStmt + 0xc4) = 0xff02;
    *(undefined8 *)(pStmt + 0x38) = 0;
    *(undefined8 *)(pStmt + 0x2c) = 0xffffffff00000001;
    *(undefined4 *)(pStmt + 0x40) = 0;
    *(undefined8 *)(pStmt + 0x50) = 0;
    if ((rc != 0) || (db->mallocFailed != '\0')) {
      iVar1 = apiHandleError(db,rc);
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_reset(sqlite3_stmt *pStmt){
  int rc;
  if( pStmt==0 ){
    rc = SQLITE_OK;
  }else{
    Vdbe *v = (Vdbe*)pStmt;
    sqlite3 *db = v->db;
    sqlite3_mutex_enter(db->mutex);
    checkProfileCallback(db, v);
    rc = sqlite3VdbeReset(v);
    sqlite3VdbeRewind(v);
    assert( (rc & (db->errMask))==rc );
    rc = sqlite3ApiExit(db, rc);
    sqlite3_mutex_leave(db->mutex);
  }
  return rc;
}